

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaTypeFixupOptimFacets(xmlSchemaTypePtr type)

{
  byte *pbVar1;
  byte bVar2;
  xmlSchemaTypeType xVar3;
  int iVar4;
  xmlSchemaTypePtr pxVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  xmlSchemaFacetPtr fac;
  xmlSchemaFacetPtr pxVar10;
  
  pxVar10 = type->facets;
  uVar9 = type->baseType->flags;
  uVar7 = uVar9 >> 0x1b;
  uVar8 = uVar7 & 1;
  uVar6 = uVar9 >> 0x15 & uVar7 & 1;
  uVar9 = uVar9 >> 0x1c & uVar7 & 1;
  do {
    if (pxVar10 == (xmlSchemaFacetPtr)0x0) {
      if (uVar9 != 0) {
        pbVar1 = (byte *)((long)&type->flags + 3);
        *pbVar1 = *pbVar1 | 0x10;
      }
      if (uVar6 == 0) {
        if (uVar8 != 0) {
          uVar9 = type->flags;
          type->flags = uVar9 | 0x8000000;
          if (((uVar9 >> 8 & 1) != 0) && (iVar4 = type->builtInType, iVar4 != 0x2e)) {
            bVar2 = *(byte *)((long)&type->flags + 1);
            pxVar5 = type;
            while ((bVar2 & 0x40) == 0) {
              pxVar5 = pxVar5->baseType;
              iVar4 = pxVar5->builtInType;
              if (iVar4 == 0x2e) {
                return;
              }
              bVar2 = *(byte *)((long)&pxVar5->flags + 1);
            }
            if (iVar4 != 1) {
              type->flags = uVar9 | 0x8200000;
            }
          }
        }
      }
      else {
        pbVar1 = (byte *)((long)&type->flags + 2);
        *pbVar1 = *pbVar1 | 0x20;
        if (uVar8 != 0) {
          pbVar1 = (byte *)((long)&type->flags + 3);
          *pbVar1 = *pbVar1 | 8;
          return;
        }
      }
      return;
    }
    xVar3 = pxVar10->type;
    if (xVar3 != XML_SCHEMA_FACET_WHITESPACE) {
      if (xVar3 == XML_SCHEMA_FACET_ENUMERATION) {
        uVar6 = 1;
LAB_001a094d:
        uVar9 = 1;
      }
      else if (xVar3 == XML_SCHEMA_FACET_PATTERN) goto LAB_001a094d;
      uVar8 = 1;
    }
    pxVar10 = pxVar10->next;
  } while( true );
}

Assistant:

static void
xmlSchemaTypeFixupOptimFacets(xmlSchemaTypePtr type)
{
    int has = 0, needVal = 0, normVal = 0;

    has	= (type->baseType->flags & XML_SCHEMAS_TYPE_HAS_FACETS) ? 1 : 0;
    if (has) {
	needVal = (type->baseType->flags &
	    XML_SCHEMAS_TYPE_FACETSNEEDVALUE) ? 1 : 0;
	normVal = (type->baseType->flags &
	    XML_SCHEMAS_TYPE_NORMVALUENEEDED) ? 1 : 0;
    }
    if (type->facets != NULL) {
	xmlSchemaFacetPtr fac;

	for (fac = type->facets; fac != NULL; fac = fac->next) {
	    switch (fac->type) {
		case XML_SCHEMA_FACET_WHITESPACE:
		    break;
		case XML_SCHEMA_FACET_PATTERN:
		    normVal = 1;
		    has = 1;
		    break;
		case XML_SCHEMA_FACET_ENUMERATION:
		    needVal = 1;
		    normVal = 1;
		    has = 1;
		    break;
		default:
		    has = 1;
		    break;
	    }
	}
    }
    if (normVal)
	type->flags |= XML_SCHEMAS_TYPE_NORMVALUENEEDED;
    if (needVal)
	type->flags |= XML_SCHEMAS_TYPE_FACETSNEEDVALUE;
    if (has)
	type->flags |= XML_SCHEMAS_TYPE_HAS_FACETS;

    if (has && (! needVal) && WXS_IS_ATOMIC(type)) {
	xmlSchemaTypePtr prim = xmlSchemaGetPrimitiveType(type);
	/*
	* OPTIMIZE VAL TODO: Some facets need a computed value.
	*/
	if ((prim->builtInType != XML_SCHEMAS_ANYSIMPLETYPE) &&
	    (prim->builtInType != XML_SCHEMAS_STRING)) {
	    type->flags |= XML_SCHEMAS_TYPE_FACETSNEEDVALUE;
	}
    }
}